

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeShortFunctionDefinition(ExpressionContext *ctx,SynShortFunctionDefinition *syntax)

{
  IntrusiveList<TypeHandle> arguments_00;
  uint uVar1;
  TypeHandle *this;
  TypeFunction *argumentType;
  ExprBase *pEVar2;
  TypeFunction *typeFunction;
  undefined1 auStack_28 [4];
  uint i;
  IntrusiveList<TypeHandle> arguments;
  SynShortFunctionDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  arguments.tail = (TypeHandle *)syntax;
  IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)auStack_28);
  typeFunction._4_4_ = 0;
  while( true ) {
    uVar1 = IntrusiveList<SynShortFunctionArgument>::size
                      ((IntrusiveList<SynShortFunctionArgument> *)&arguments.tail[2].listed);
    if (uVar1 <= typeFunction._4_4_) break;
    this = ExpressionContext::get<TypeHandle>(ctx);
    TypeHandle::TypeHandle(this,ctx->typeGeneric);
    IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)auStack_28,this);
    typeFunction._4_4_ = typeFunction._4_4_ + 1;
  }
  arguments_00.tail = arguments.head;
  arguments_00.head = _auStack_28;
  argumentType = ExpressionContext::GetFunctionType
                           (ctx,(SynBase *)arguments.tail,ctx->typeGeneric,arguments_00);
  pEVar2 = AnalyzeShortFunctionDefinition
                     (ctx,(SynShortFunctionDefinition *)arguments.tail,(FunctionData *)0x0,
                      argumentType);
  return pEVar2;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax)
{
	IntrusiveList<TypeHandle> arguments;

	for(unsigned i = 0; i < syntax->arguments.size(); i++)
		arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeGeneric));

	TypeFunction *typeFunction = ctx.GetFunctionType(syntax, ctx.typeGeneric, arguments);

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, typeFunction);
}